

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midi_container.cpp
# Opt level: O0

void __thiscall midi_event::midi_event(midi_event *this,midi_event *p_in)

{
  midi_event *p_in_local;
  midi_event *this_local;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->m_ext_data);
  this->m_timestamp = p_in->m_timestamp;
  this->m_channel = p_in->m_channel;
  this->m_type = p_in->m_type;
  this->m_data_count = p_in->m_data_count;
  memcpy(this->m_data,p_in->m_data,this->m_data_count);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            (&this->m_ext_data,&p_in->m_ext_data);
  return;
}

Assistant:

midi_event::midi_event( const midi_event & p_in )
{
    m_timestamp = p_in.m_timestamp;
    m_channel = p_in.m_channel;
    m_type = p_in.m_type;
    m_data_count = p_in.m_data_count;
    memcpy( m_data, p_in.m_data, m_data_count );
    m_ext_data = p_in.m_ext_data;
}